

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::split_inner_node(btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
                   *this,inner_node *inner,key_type *_newkey,node **_newinner,uint addslot)

{
  uint uVar1;
  inner_node *__result;
  node **in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *unaff_retaddr;
  inner_node *newinner;
  uint mid;
  
  uVar1 = (int)(uint)*(ushort *)(in_RSI + 2) >> 1;
  if ((in_R8D <= uVar1) && ((uint)*(ushort *)(in_RSI + 2) - (uVar1 + 1) < uVar1)) {
    uVar1 = uVar1 - 1;
  }
  __result = allocate_inner(unaff_retaddr,(unsigned_short)((ulong)in_RDI >> 0x30));
  (__result->super_node).slotuse = *(short *)(in_RSI + 2) - ((short)uVar1 + 1);
  std::copy<double*,double*>((double *)in_RCX,(double *)CONCAT44(in_R8D,uVar1),(double *)__result);
  std::
  copy<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**,stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**>
            (in_RCX,(node **)CONCAT44(in_R8D,uVar1),(node **)__result);
  *(short *)(in_RSI + 2) = (short)uVar1;
  *in_RDX = *(undefined8 *)(in_RSI + 8 + (ulong)uVar1 * 8);
  *in_RCX = &__result->super_node;
  return;
}

Assistant:

void split_inner_node(inner_node* inner, key_type* _newkey, node** _newinner, unsigned int addslot)
        {
            BTREE_ASSERT(inner->isfull());

            unsigned int mid = (inner->slotuse >> 1);

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            // if the split is uneven and the overflowing item will be put into the
            // larger node, then the smaller split node may underflow
            if (addslot <= mid && mid > inner->slotuse - (mid + 1))
                mid--;

            BTREE_PRINT("btree::split_inner: mid " << mid << " addslot " << addslot);

            BTREE_PRINT("btree::split_inner_node on " << inner << " into two nodes " << mid << " and " << inner->slotuse - (mid + 1) << " sized");

            inner_node *newinner = allocate_inner(inner->level);

            newinner->slotuse = inner->slotuse - (mid + 1);

            std::copy(inner->slotkey + mid+1, inner->slotkey + inner->slotuse,
                      newinner->slotkey);
            std::copy(inner->childid + mid+1, inner->childid + inner->slotuse+1,
                      newinner->childid);

            inner->slotuse = mid;

            *_newkey = inner->slotkey[mid];
            *_newinner = newinner;
        }